

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

void __thiscall spirv_cross::CompilerGLSL::emit_resources(CompilerGLSL *this)

{
  uint32_t *ts_2;
  Types TVar1;
  size_t sVar2;
  Variant *pVVar3;
  size_t sVar4;
  bool bVar5;
  uint32_t uVar6;
  uint uVar7;
  StorageClass SVar8;
  ExecutionModel EVar9;
  SPIREntryPoint *pSVar10;
  SPIRConstant *constant;
  SPIRUndef *pSVar11;
  SPIRConstantOp *constant_00;
  SPIRType *pSVar12;
  uint *puVar13;
  SPIRVariable *pSVar14;
  mapped_type *pmVar15;
  string *psVar16;
  ulong uVar17;
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar18;
  ID *__k;
  BaseType BVar19;
  long lVar20;
  TypedID<(spirv_cross::Types)0> *pTVar21;
  byte bVar22;
  char *pcVar23;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *elem;
  char *pcVar24;
  bool bVar25;
  bool emitted;
  bool emitted_base_instance;
  SpecializationConstant wg_z;
  SpecializationConstant wg_y;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  inputs;
  char *storage;
  char local_1299;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1298;
  SpecializationConstant local_1290;
  ParsedIR *local_1288;
  SPIREntryPoint *local_1280;
  string local_1278;
  _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_1258;
  SpecializationConstant local_1250;
  SpecializationConstant local_1248;
  undefined1 local_1240 [24];
  char local_1228 [256];
  undefined1 local_1128 [4120];
  Buffer *local_110;
  size_t local_108;
  size_t local_100;
  Buffer local_f8 [8];
  
  pSVar10 = Compiler::get_entry_point(&this->super_Compiler);
  (*(this->super_Compiler)._vptr_Compiler[0x3d])(this);
  if (pSVar10->model == ExecutionModelFragment) {
    uVar7 = 0x81;
    if ((this->options).es != false) {
      uVar7 = 299;
    }
    if ((this->options).version <= uVar7) {
      replace_fragment_outputs(this);
    }
  }
  if (((this->pls_inputs).
       super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>._M_impl.
       super__Vector_impl_data._M_start !=
       (this->pls_inputs).
       super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>._M_impl.
       super__Vector_impl_data._M_finish) ||
     ((this->pls_outputs).
      super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->pls_outputs).
      super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    emit_pls(this);
  }
  EVar9 = pSVar10->model;
  if ((EVar9 - ExecutionModelTessellationControl < 3) || (EVar9 == ExecutionModelMeshEXT)) {
    fixup_implicit_builtin_block_names(this,EVar9);
  }
  if ((this->super_Compiler).position_invariant == true) {
    bVar25 = true;
    if ((this->options).es == false) {
      bVar25 = 0x77 < (this->options).version;
    }
  }
  else {
    bVar25 = false;
  }
  local_1280 = pSVar10;
  if (((this->options).separate_shader_objects == true) && ((this->options).es == false)) {
    EVar9 = pSVar10->model;
    if (3 < (int)EVar9) {
      if (EVar9 == ExecutionModelFragment) goto LAB_002b413e;
      if (EVar9 != ExecutionModelMeshEXT) goto LAB_002b4273;
      goto LAB_002b41aa;
    }
    if (EVar9 - ExecutionModelTessellationControl < 3) {
      emit_declared_builtin_block(this,Input,EVar9);
      goto LAB_002b419b;
    }
    if (EVar9 == ExecutionModelVertex) goto LAB_002b41aa;
  }
  else {
LAB_002b413e:
    bVar5 = should_force_emit_builtin_block(this,Output);
    if (bVar5) {
LAB_002b419b:
      EVar9 = pSVar10->model;
LAB_002b41aa:
      emit_declared_builtin_block(this,Output,EVar9);
      goto LAB_002b4296;
    }
    if (pSVar10->geometry_passthrough == true) {
      emit_declared_builtin_block(this,Input,pSVar10->model);
    }
    else {
      local_1128._0_8_ = "out";
      if (pSVar10->model == ExecutionModelFragment) {
        local_1128._0_8_ = "in";
      }
      ts_2 = &(this->super_Compiler).clip_distance_count;
      if ((this->super_Compiler).clip_distance_count != 0) {
        statement<char_const*&,char_const(&)[24],unsigned_int&,char_const(&)[3]>
                  (this,(char **)local_1128,(char (*) [24])0x39d755,ts_2,(char (*) [3])0x3822d7);
      }
      if ((this->super_Compiler).cull_distance_count == 0) {
        bVar5 = true;
      }
      else {
        statement<char_const*&,char_const(&)[24],unsigned_int&,char_const(&)[3]>
                  (this,(char **)local_1128,(char (*) [24])0x39d76e,
                   &(this->super_Compiler).cull_distance_count,(char (*) [3])0x3822d7);
        bVar5 = (this->super_Compiler).cull_distance_count == 0;
      }
      if ((*ts_2 != 0) || (!bVar5)) {
        statement<char_const(&)[1]>(this,(char (*) [1])0x34ea49);
      }
    }
  }
LAB_002b4273:
  if (bVar25) {
    statement<char_const(&)[23]>(this,(char (*) [23])"invariant gl_Position;");
    statement<char_const(&)[1]>(this,(char (*) [1])0x34ea49);
  }
LAB_002b4296:
  local_1299 = '\0';
  local_1288 = &(this->super_Compiler).ir;
  ParsedIR::create_loop_hard_lock(local_1288);
  sVar2 = (this->super_Compiler).ir.ids_for_constant_undef_or_type.
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  if (sVar2 != 0) {
    local_1298 = (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(this->super_Compiler).ir.ids_for_constant_undef_or_type.
                    super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    lVar20 = 0;
    do {
      pbVar18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr;
      pVVar3 = (Variant *)
               (&pbVar18->_M_dataplus + (ulong)*(uint *)((long)&local_1298->_M_h + lVar20) * 3);
      TVar1 = pVVar3->type;
      if ((int)TVar1 < 9) {
        if (TVar1 == TypeType) {
          pSVar12 = Variant::get<spirv_cross::SPIRType>(pVVar3);
          if (pSVar12->basetype == Struct) {
            if ((((pSVar12->array).super_VectorView<unsigned_int>.buffer_size != 0) ||
                (pSVar12->pointer != false)) ||
               (bVar25 = Compiler::has_decoration
                                   (&this->super_Compiler,(ID)(pSVar12->super_IVariant).self.id,
                                    Block), bVar25)) {
              bVar25 = false;
            }
            else {
              bVar25 = Compiler::has_decoration
                                 (&this->super_Compiler,(ID)(pSVar12->super_IVariant).self.id,
                                  BufferBlock);
              bVar25 = !bVar25;
            }
            if (((pSVar12->basetype == Struct) && (pSVar12->pointer == true)) &&
               ((bVar5 = Compiler::has_decoration
                                   (&this->super_Compiler,(ID)(pSVar12->super_IVariant).self.id,
                                    Block), bVar5 &&
                ((uVar7 = pSVar12->storage - RayPayloadKHR, uVar7 < 5 &&
                 ((0x13U >> (uVar7 & 0x1f) & 1) != 0)))))) {
              pSVar12 = Variant::get<spirv_cross::SPIRType>
                                  ((this->super_Compiler).ir.ids.
                                   super_VectorView<spirv_cross::Variant>.ptr +
                                   (pSVar12->parent_type).id);
            }
            else if (!bVar25) goto LAB_002b45dd;
            if (local_1299 == '\x01') {
              statement<char_const(&)[1]>(this,(char (*) [1])0x34ea49);
            }
            local_1299 = '\0';
            emit_struct(this,pSVar12);
          }
        }
        else if (TVar1 == TypeConstant) {
          constant = Variant::get<spirv_cross::SPIRConstant>(pVVar3);
          if ((constant->specialization != false) || ((constant->is_used_as_lut & 1U) != 0)) {
            if ((constant->specialization != false) && ((this->options).vulkan_semantics == false))
            {
              uVar6 = Compiler::get_decoration
                                (&this->super_Compiler,(ID)(constant->super_IVariant).self.id,
                                 DecorationSpecId);
              local_1240._0_4_ = uVar6;
              join<char_const(&)[25],unsigned_int&>
                        ((string *)local_1128,(spirv_cross *)"SPIRV_CROSS_CONSTANT_ID_",
                         (char (*) [25])local_1240,(uint *)pbVar18);
              ::std::__cxx11::string::operator=
                        ((string *)&constant->specialization_constant_macro_name,
                         (string *)local_1128);
              if ((undefined1 *)local_1128._0_8_ != local_1128 + 0x10) {
                operator_delete((void *)local_1128._0_8_);
              }
            }
            emit_constant(this,constant);
            goto LAB_002b45d8;
          }
        }
      }
      else if (TVar1 == TypeConstantOp) {
        constant_00 = Variant::get<spirv_cross::SPIRConstantOp>(pVVar3);
        emit_specialization_constant_op(this,constant_00);
LAB_002b45d8:
        local_1299 = '\x01';
      }
      else if (TVar1 == TypeUndef) {
        pSVar11 = Variant::get<spirv_cross::SPIRUndef>(pVVar3);
        pSVar12 = Variant::get<spirv_cross::SPIRType>
                            ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.
                             ptr + *(uint *)&(pSVar11->super_IVariant).field_0xc);
        if ((pSVar12->basetype != Void) &&
           (bVar25 = Compiler::type_is_top_level_block(&this->super_Compiler,pSVar12), !bVar25)) {
          local_1128._0_8_ = local_1128 + 0x10;
          local_1128._8_8_ = 0;
          local_1128._16_8_ = local_1128._16_8_ & 0xffffffffffffff00;
          if (((this->options).force_zero_initialized_variables == true) &&
             (bVar25 = type_can_zero_initialize(this,pSVar12), bVar25)) {
            (*(this->super_Compiler)._vptr_Compiler[0x3b])
                      (&local_1278,this,(ulong)*(uint *)&(pSVar11->super_IVariant).field_0xc);
            join<char_const(&)[4],std::__cxx11::string>
                      ((string *)local_1240,(spirv_cross *)0x3980ec,(char (*) [4])&local_1278,
                       pbVar18);
            ::std::__cxx11::string::operator=((string *)local_1128,(string *)local_1240);
            if ((undefined1 *)local_1240._0_8_ != local_1240 + 0x10) {
              operator_delete((void *)local_1240._0_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1278._M_dataplus._M_p != &local_1278.field_2) {
              operator_delete(local_1278._M_dataplus._M_p);
            }
          }
          (*(this->super_Compiler)._vptr_Compiler[6])
                    (&local_1278,this,(ulong)(pSVar11->super_IVariant).self.id,1);
          (*(this->super_Compiler)._vptr_Compiler[0x1b])
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1240
                     ,this,pSVar12,&local_1278,(ulong)(pSVar11->super_IVariant).self.id);
          statement<std::__cxx11::string,std::__cxx11::string&,char_const(&)[2]>
                    (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_1240,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128
                     ,(char (*) [2])0x397f80);
          if ((undefined1 *)local_1240._0_8_ != local_1240 + 0x10) {
            operator_delete((void *)local_1240._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1278._M_dataplus._M_p != &local_1278.field_2) {
            operator_delete(local_1278._M_dataplus._M_p);
          }
          local_1299 = '\x01';
          if ((undefined1 *)local_1128._0_8_ != local_1128 + 0x10) {
            operator_delete((void *)local_1128._0_8_);
          }
        }
      }
LAB_002b45dd:
      lVar20 = lVar20 + 4;
    } while (sVar2 << 2 != lVar20);
  }
  ParsedIR::LoopLock::~LoopLock((LoopLock *)&local_1290);
  if (local_1299 != '\0') {
    statement<char_const(&)[1]>(this,(char (*) [1])0x34ea49);
  }
  if (((local_1280->model == ExecutionModelGLCompute) && ((this->options).vulkan_semantics == false)
      ) && (((local_1280->workgroup_size).constant != 0 ||
            (((local_1280->flags).lower & 0x4000000000) != 0)))) {
    local_1290.id.id = 0;
    local_1248.id.id = 0;
    local_1250.id.id = 0;
    Compiler::get_work_group_size_specialization_constants
              (&this->super_Compiler,&local_1290,&local_1248,&local_1250);
    if (((local_1290.id.id != 0) || (local_1248.id.id != 0)) || (local_1250.id.id != 0)) {
      local_1240._0_8_ = local_1228;
      local_1240._8_8_ = 0;
      local_1240._16_8_ = 8;
      build_workgroup_size
                (this,(SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                       *)local_1240,&local_1290,&local_1248,&local_1250);
      local_110 = local_f8;
      local_1128._16_8_ = 0;
      local_1128._0_8_ = (char *)0x0;
      local_1128._8_8_ = 0;
      local_108 = 0;
      local_100 = 8;
      StringStream<4096UL,_4096UL>::reset((StringStream<4096UL,_4096UL> *)local_1128);
      if (local_1240._8_8_ != 0) {
        pcVar23 = (char *)(local_1240._0_8_ + local_1240._8_8_ * 0x20);
        pcVar24 = (char *)local_1240._0_8_;
        do {
          StringStream<4096UL,_4096UL>::append
                    ((StringStream<4096UL,_4096UL> *)local_1128,*(char **)pcVar24,
                     *(size_t *)(pcVar24 + 8));
          if (pcVar24 != (char *)(local_1240._0_8_ + local_1240._8_8_ * 0x20 + -0x20)) {
            StringStream<4096UL,_4096UL>::append((StringStream<4096UL,_4096UL> *)local_1128,", ",2);
          }
          pcVar24 = pcVar24 + 0x20;
        } while (pcVar24 != pcVar23);
      }
      StringStream<4096ul,4096ul>::str_abi_cxx11_(&local_1278,local_1128);
      StringStream<4096UL,_4096UL>::~StringStream((StringStream<4096UL,_4096UL> *)local_1128);
      statement<char_const(&)[8],std::__cxx11::string,char_const(&)[6]>
                (this,(char (*) [8])"layout(",&local_1278,(char (*) [6])0x39bcbd);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1278._M_dataplus._M_p != &local_1278.field_2) {
        operator_delete(local_1278._M_dataplus._M_p);
      }
      statement<char_const(&)[1]>(this,(char (*) [1])0x34ea49);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::~SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                      *)local_1240);
    }
  }
  local_1299 = '\0';
  if ((this->super_Compiler).ir.addressing_model == AddressingModelPhysicalStorageBuffer64) {
    ParsedIR::create_loop_hard_lock(local_1288);
    sVar2 = (this->super_Compiler).ir.ids_for_type[1].
            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
    if (sVar2 != 0) {
      pTVar21 = (this->super_Compiler).ir.ids_for_type[1].
                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
      lVar20 = 0;
      do {
        uVar7 = *(uint *)((long)&pTVar21->id + lVar20);
        pVVar3 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr;
        if (pVVar3[uVar7].type == TypeType) {
          pSVar12 = Variant::get<spirv_cross::SPIRType>(pVVar3 + uVar7);
          local_1240._0_4_ = uVar7;
          bVar25 = Compiler::is_physical_pointer(&this->super_Compiler,pSVar12);
          if (bVar25) {
            bVar25 = Compiler::is_physical_pointer_to_buffer_block(&this->super_Compiler,pSVar12);
            if (!bVar25) {
              puVar13 = (this->super_Compiler).physical_storage_non_block_pointer_types.
                        super_VectorView<unsigned_int>.ptr;
              puVar13 = ::std::
                        __find_if<unsigned_int*,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                                  (puVar13,puVar13 + (this->super_Compiler).
                                                     physical_storage_non_block_pointer_types.
                                                     super_VectorView<unsigned_int>.buffer_size,
                                   local_1240);
              if (puVar13 ==
                  (this->super_Compiler).physical_storage_non_block_pointer_types.
                  super_VectorView<unsigned_int>.ptr +
                  (this->super_Compiler).physical_storage_non_block_pointer_types.
                  super_VectorView<unsigned_int>.buffer_size) goto LAB_002b48d9;
              uVar7 = (uint)local_1240._0_8_;
            }
            emit_buffer_reference_block(this,uVar7,true);
          }
        }
LAB_002b48d9:
        lVar20 = lVar20 + 4;
      } while (sVar2 << 2 != lVar20);
    }
    ParsedIR::LoopLock::~LoopLock((LoopLock *)local_1128);
    sVar2 = (this->super_Compiler).physical_storage_non_block_pointer_types.
            super_VectorView<unsigned_int>.buffer_size;
    if (sVar2 != 0) {
      puVar13 = (this->super_Compiler).physical_storage_non_block_pointer_types.
                super_VectorView<unsigned_int>.ptr;
      lVar20 = 0;
      do {
        emit_buffer_reference_block(this,*(uint32_t *)((long)puVar13 + lVar20),false);
        lVar20 = lVar20 + 4;
      } while (sVar2 << 2 != lVar20);
    }
    ParsedIR::create_loop_hard_lock(local_1288);
    sVar2 = (this->super_Compiler).ir.ids_for_type[1].
            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
    if (sVar2 != 0) {
      pTVar21 = (this->super_Compiler).ir.ids_for_type[1].
                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
      lVar20 = 0;
      do {
        uVar7 = *(uint *)((long)&pTVar21->id + lVar20);
        pVVar3 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr;
        if (pVVar3[uVar7].type == TypeType) {
          pSVar12 = Variant::get<spirv_cross::SPIRType>(pVVar3 + uVar7);
          bVar25 = Compiler::is_physical_pointer_to_buffer_block(&this->super_Compiler,pSVar12);
          if (bVar25) {
            emit_buffer_reference_block(this,uVar7,false);
          }
        }
        lVar20 = lVar20 + 4;
      } while (sVar2 << 2 != lVar20);
    }
    ParsedIR::LoopLock::~LoopLock((LoopLock *)local_1128);
  }
  ParsedIR::create_loop_hard_lock(local_1288);
  local_1298 = (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(this->super_Compiler).ir.ids_for_type[2].
                  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  if (local_1298 !=
      (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)0x0) {
    local_1280 = (SPIREntryPoint *)
                 (this->super_Compiler).ir.ids_for_type[2].
                 super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    local_1258 = (_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  *)&(this->super_Compiler).ir.meta;
    local_1298 = (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)local_1298 << 2);
    pTVar21 = (TypedID<(spirv_cross::Types)0> *)0x0;
    do {
      uVar7 = *(uint *)((long)&pTVar21->id +
                       (long)(&(local_1280->interface_variables).stack_storage + -3));
      pVVar3 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr;
      if (pVVar3[uVar7].type == TypeVariable) {
        pSVar14 = Variant::get<spirv_cross::SPIRVariable>(pVVar3 + uVar7);
        pSVar12 = Variant::get<spirv_cross::SPIRType>
                            ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.
                             ptr + *(uint *)&(pSVar14->super_IVariant).field_0xc);
        SVar8 = pSVar12->storage;
        bVar22 = 1;
        if (((SVar8 != StorageClassUniform) && (SVar8 != StorageBuffer)) &&
           (SVar8 != ShaderRecordBufferKHR)) {
          bVar22 = 0;
        }
        __k = &(pSVar12->super_IVariant).self;
        pmVar15 = ::std::__detail::
                  _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[](local_1258,__k);
        if (((pmVar15->decoration).decoration_flags.lower & 4) == 0) {
          pmVar15 = ::std::__detail::
                    _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[](local_1258,__k);
          bVar25 = ((pmVar15->decoration).decoration_flags.lower & 8) == 0;
        }
        else {
          bVar25 = false;
        }
        if (((pSVar14->storage != Function) && ((bVar22 & pSVar12->pointer) != 0)) &&
           (bVar5 = Compiler::is_hidden_variable(&this->super_Compiler,pSVar14,false),
           !bVar25 && !bVar5)) {
          (*(this->super_Compiler)._vptr_Compiler[0x21])(this,pSVar14);
        }
      }
      pTVar21 = pTVar21 + 1;
    } while (local_1298 !=
             (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)pTVar21);
  }
  ParsedIR::LoopLock::~LoopLock((LoopLock *)local_1128);
  ParsedIR::create_loop_hard_lock(local_1288);
  sVar2 = (this->super_Compiler).ir.ids_for_type[2].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  if (sVar2 != 0) {
    pTVar21 = (this->super_Compiler).ir.ids_for_type[2].
              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    lVar20 = 0;
    do {
      uVar7 = *(uint *)((long)&pTVar21->id + lVar20);
      pVVar3 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr;
      if (pVVar3[uVar7].type == TypeVariable) {
        pSVar14 = Variant::get<spirv_cross::SPIRVariable>(pVVar3 + uVar7);
        pSVar12 = Variant::get<spirv_cross::SPIRType>
                            ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.
                             ptr + *(uint *)&(pSVar14->super_IVariant).field_0xc);
        if ((((pSVar14->storage != Function) && (pSVar12->pointer == true)) &&
            (pSVar12->storage == PushConstant)) &&
           (bVar25 = Compiler::is_hidden_variable(&this->super_Compiler,pSVar14,false), !bVar25)) {
          (*(this->super_Compiler)._vptr_Compiler[0x22])(this,pSVar14);
        }
      }
      lVar20 = lVar20 + 4;
    } while (sVar2 << 2 != lVar20);
  }
  ParsedIR::LoopLock::~LoopLock((LoopLock *)local_1128);
  sVar2 = (this->super_Compiler).combined_image_samplers.
          super_VectorView<spirv_cross::CombinedImageSampler>.buffer_size;
  bVar25 = (this->options).vulkan_semantics;
  ParsedIR::create_loop_hard_lock(local_1288);
  sVar4 = (this->super_Compiler).ir.ids_for_type[2].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  if (sVar4 != 0) {
    pTVar21 = (this->super_Compiler).ir.ids_for_type[2].
              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    lVar20 = 0;
    do {
      uVar7 = *(uint *)((long)&pTVar21->id + lVar20);
      pVVar3 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr;
      if (pVVar3[uVar7].type == TypeVariable) {
        pSVar14 = Variant::get<spirv_cross::SPIRVariable>(pVVar3 + uVar7);
        pSVar12 = Variant::get<spirv_cross::SPIRType>
                            ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.
                             ptr + *(uint *)&(pSVar14->super_IVariant).field_0xc);
        if ((((sVar2 == 0 & bVar25) != 0) ||
            (BVar19 = pSVar12->basetype ^ Image,
            (pSVar12->image).dim == Buffer && BVar19 == Unknown ||
            pSVar12->basetype != Sampler && ((pSVar12->image).sampled != 1 || BVar19 != Unknown)))
           && ((pSVar14->storage != Function && (pSVar12->pointer == true)))) {
          SVar8 = pSVar12->storage;
          if ((((SVar8 - CallableDataKHR < 0xf) &&
               ((0x4c03U >> (SVar8 - CallableDataKHR & 0x1f) & 1) != 0)) ||
              ((SVar8 == AtomicCounter || (SVar8 == StorageClassUniformConstant)))) &&
             (bVar5 = Compiler::is_hidden_variable(&this->super_Compiler,pSVar14,false), !bVar5)) {
            (*(this->super_Compiler)._vptr_Compiler[0x23])(this,pSVar14);
            local_1299 = '\x01';
          }
        }
      }
      lVar20 = lVar20 + 4;
    } while (sVar4 << 2 != lVar20);
  }
  ParsedIR::LoopLock::~LoopLock((LoopLock *)local_1128);
  if (local_1299 == '\x01') {
    statement<char_const(&)[1]>(this,(char (*) [1])0x34ea49);
  }
  local_1240._0_8_ = &local_1299;
  local_1299 = '\0';
  local_1290.id.id = local_1290.id.id & 0xffffff00;
  local_1278._M_dataplus._M_p = (pointer)&local_1290;
  ParsedIR::create_loop_hard_lock(local_1288);
  sVar2 = (this->super_Compiler).ir.ids_for_type[2].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  if (sVar2 != 0) {
    local_1298 = (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(this->super_Compiler).ir.ids_for_type[2].
                    super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    lVar20 = 0;
    do {
      uVar7 = *(uint *)((long)&(local_1298->_M_h)._M_buckets + lVar20);
      pVVar3 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr;
      if (pVVar3[uVar7].type == TypeVariable) {
        pSVar14 = Variant::get<spirv_cross::SPIRVariable>(pVVar3 + uVar7);
        pSVar12 = Variant::get<spirv_cross::SPIRType>
                            ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.
                             ptr + *(uint *)&(pSVar14->super_IVariant).field_0xc);
        bVar25 = Compiler::is_hidden_variable(&this->super_Compiler,pSVar14,false);
        SVar8 = pSVar14->storage;
        if (SVar8 == Output) {
          uVar7 = 0x81;
          if ((this->options).es != false) {
            uVar7 = 299;
          }
          SVar8 = Output;
          if (uVar7 < (this->options).version) {
            uVar6 = Compiler::get_decoration
                              (&this->super_Compiler,(ID)(pSVar14->super_IVariant).self.id,
                               DecorationLocation);
            bVar5 = location_is_framebuffer_fetch(this,uVar6);
            bVar25 = bVar25 && !bVar5;
            SVar8 = pSVar14->storage;
            goto LAB_002b4da3;
          }
LAB_002b4da8:
          if (((pSVar12->pointer != true) || ((SVar8 | StorageClassUniform) != Output)) ||
             (bVar5 = Compiler::interface_variable_exists_in_entry_point
                                (&this->super_Compiler,(pSVar14->super_IVariant).self.id),
             bVar25 != false || !bVar5)) goto LAB_002b4dcd;
          if (((((this->options).es == true) &&
               (EVar9 = Compiler::get_execution_model(&this->super_Compiler),
               EVar9 == ExecutionModelVertex)) && (pSVar14->storage == Input)) &&
             ((pSVar12->array).super_VectorView<unsigned_int>.buffer_size == 1)) {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            ::std::runtime_error::runtime_error
                      (this_00,"OpenGL ES doesn\'t support array input variables in vertex shader.")
            ;
            *(undefined ***)this_00 = &PTR__runtime_error_0048ff00;
            __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
          }
          emit_interface_block(this,pSVar14);
          psVar16 = (string *)local_1240;
LAB_002b4f34:
          *(psVar16->_M_dataplus)._M_p = '\x01';
        }
        else {
LAB_002b4da3:
          if (SVar8 != Function) goto LAB_002b4da8;
LAB_002b4dcd:
          bVar25 = Compiler::is_builtin_variable(&this->super_Compiler,pSVar14);
          if ((bVar25) &&
             (uVar6 = Compiler::get_decoration
                                (&this->super_Compiler,(ID)(pSVar14->super_IVariant).self.id,BuiltIn
                                ), (this->options).vulkan_semantics == false)) {
            if (((char)local_1290.id.id == '\0') &&
               ((uVar6 == 0x1149 ||
                ((uVar6 == 0x2b & (this->options).vertex.support_nonzero_base_instance) != 0)))) {
              statement<char_const(&)[37]>
                        (this,(char (*) [37])"#ifdef GL_ARB_shader_draw_parameters");
              statement<char_const(&)[52]>
                        (this,(char (*) [52])"#define SPIRV_Cross_BaseInstance gl_BaseInstanceARB");
              statement<char_const(&)[6]>(this,(char (*) [6])"#else");
              statement<char_const(&)[38]>
                        (this,(char (*) [38])"uniform int SPIRV_Cross_BaseInstance;");
              statement<char_const(&)[7]>(this,(char (*) [7])0x34ed2b);
              local_1299 = '\x01';
              psVar16 = &local_1278;
              goto LAB_002b4f34;
            }
            if (uVar6 == 0x114a) {
              statement<char_const(&)[38]>
                        (this,(char (*) [38])"#ifndef GL_ARB_shader_draw_parameters");
              statement<char_const(&)[55]>
                        (this,(char (*) [55])
                              "#error GL_ARB_shader_draw_parameters is not supported.");
            }
            else {
              if (uVar6 != 0x1148) goto LAB_002b4f3a;
              statement<char_const(&)[37]>
                        (this,(char (*) [37])"#ifdef GL_ARB_shader_draw_parameters");
              statement<char_const(&)[48]>
                        (this,(char (*) [48])"#define SPIRV_Cross_BaseVertex gl_BaseVertexARB");
              statement<char_const(&)[6]>(this,(char (*) [6])"#else");
              statement<char_const(&)[36]>
                        (this,(char (*) [36])"uniform int SPIRV_Cross_BaseVertex;");
            }
            statement<char_const(&)[7]>(this,(char (*) [7])0x34ed2b);
          }
        }
      }
LAB_002b4f3a:
      lVar20 = lVar20 + 4;
    } while (sVar2 << 2 != lVar20);
  }
  ParsedIR::LoopLock::~LoopLock((LoopLock *)local_1128);
  sVar2 = (this->super_Compiler).global_variables.super_VectorView<unsigned_int>.buffer_size;
  if (sVar2 != 0) {
    puVar13 = (this->super_Compiler).global_variables.super_VectorView<unsigned_int>.ptr;
    local_1298 = &this->resource_names;
    local_1280 = (SPIREntryPoint *)&this->block_names;
    local_1258 = (_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  *)&(this->super_Compiler).ir.meta;
    lVar20 = 0;
    do {
      pSVar14 = Variant::get<spirv_cross::SPIRVariable>
                          ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr
                           + *(uint *)((long)puVar13 + lVar20));
      bVar25 = Compiler::is_hidden_variable(&this->super_Compiler,pSVar14,true);
      if (!bVar25) {
        if (pSVar14->storage == Output) {
          uVar17 = (ulong)(pSVar14->initializer).id;
          if (((uVar17 != 0) &&
              (uVar17 < (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.
                        buffer_size)) &&
             (pVVar3 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr,
             pVVar3[uVar17].type == TypeConstant)) {
            Variant::get<spirv_cross::SPIRConstant>(pVVar3 + uVar17);
            emit_output_variable_initializer(this,pSVar14);
          }
        }
        else {
          bVar25 = variable_is_lut(this,pSVar14);
          if (!bVar25) {
            local_1128._0_4_ = (pSVar14->super_IVariant).self.id;
            pmVar15 = ::std::__detail::
                      _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[](local_1258,(key_type *)local_1128);
            add_variable(this,local_1298,
                         (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_1280,(string *)pmVar15);
            local_1128._0_8_ = local_1128 + 0x10;
            local_1128._8_8_ = 0;
            local_1128._16_8_ = local_1128._16_8_ & 0xffffffffffffff00;
            if ((((this->options).force_zero_initialized_variables == true) &&
                (pSVar14->storage == Private)) &&
               (((pSVar14->initializer).id == 0 && ((pSVar14->static_expression).id == 0)))) {
              pSVar12 = Compiler::get_variable_data_type(&this->super_Compiler,pSVar14);
              bVar25 = type_can_zero_initialize(this,pSVar12);
              if (bVar25) {
                uVar6 = Compiler::get_variable_data_type_id(&this->super_Compiler,pSVar14);
                pbVar18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (this->super_Compiler)._vptr_Compiler;
                (**(code **)((long)&pbVar18[0xe].field_2 + 8))(&local_1278,this,uVar6);
                join<char_const(&)[4],std::__cxx11::string>
                          ((string *)local_1240,(spirv_cross *)0x3980ec,(char (*) [4])&local_1278,
                           pbVar18);
                ::std::__cxx11::string::operator=((string *)local_1128,(string *)local_1240);
                if ((undefined1 *)local_1240._0_8_ != local_1240 + 0x10) {
                  operator_delete((void *)local_1240._0_8_);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1278._M_dataplus._M_p != &local_1278.field_2) {
                  operator_delete(local_1278._M_dataplus._M_p);
                }
              }
            }
            (*(this->super_Compiler)._vptr_Compiler[0x28])
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1240,this,pSVar14);
            statement<std::__cxx11::string,std::__cxx11::string&,char_const(&)[2]>
                      (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_1240,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1128,(char (*) [2])0x397f80);
            if ((undefined1 *)local_1240._0_8_ != local_1240 + 0x10) {
              operator_delete((void *)local_1240._0_8_);
            }
            local_1299 = '\x01';
            if ((undefined1 *)local_1128._0_8_ != local_1128 + 0x10) {
              operator_delete((void *)local_1128._0_8_);
            }
          }
        }
      }
      lVar20 = lVar20 + 4;
    } while (sVar2 << 2 != lVar20);
  }
  if (local_1299 != '\0') {
    statement<char_const(&)[1]>(this,(char (*) [1])0x34ea49);
  }
  return;
}

Assistant:

void CompilerGLSL::emit_resources()
{
	auto &execution = get_entry_point();

	replace_illegal_names();

	// Legacy GL uses gl_FragData[], redeclare all fragment outputs
	// with builtins.
	if (execution.model == ExecutionModelFragment && is_legacy())
		replace_fragment_outputs();

	// Emit PLS blocks if we have such variables.
	if (!pls_inputs.empty() || !pls_outputs.empty())
		emit_pls();

	switch (execution.model)
	{
	case ExecutionModelGeometry:
	case ExecutionModelTessellationControl:
	case ExecutionModelTessellationEvaluation:
	case ExecutionModelMeshEXT:
		fixup_implicit_builtin_block_names(execution.model);
		break;

	default:
		break;
	}

	bool global_invariant_position = position_invariant && (options.es || options.version >= 120);

	// Emit custom gl_PerVertex for SSO compatibility.
	if (options.separate_shader_objects && !options.es && execution.model != ExecutionModelFragment)
	{
		switch (execution.model)
		{
		case ExecutionModelGeometry:
		case ExecutionModelTessellationControl:
		case ExecutionModelTessellationEvaluation:
			emit_declared_builtin_block(StorageClassInput, execution.model);
			emit_declared_builtin_block(StorageClassOutput, execution.model);
			global_invariant_position = false;
			break;

		case ExecutionModelVertex:
		case ExecutionModelMeshEXT:
			emit_declared_builtin_block(StorageClassOutput, execution.model);
			global_invariant_position = false;
			break;

		default:
			break;
		}
	}
	else if (should_force_emit_builtin_block(StorageClassOutput))
	{
		emit_declared_builtin_block(StorageClassOutput, execution.model);
		global_invariant_position = false;
	}
	else if (execution.geometry_passthrough)
	{
		// Need to declare gl_in with Passthrough.
		// If we're doing passthrough, we cannot emit an output block, so the output block test above will never pass.
		emit_declared_builtin_block(StorageClassInput, execution.model);
	}
	else
	{
		// Need to redeclare clip/cull distance with explicit size to use them.
		// SPIR-V mandates these builtins have a size declared.
		const char *storage = execution.model == ExecutionModelFragment ? "in" : "out";
		if (clip_distance_count != 0)
			statement(storage, " float gl_ClipDistance[", clip_distance_count, "];");
		if (cull_distance_count != 0)
			statement(storage, " float gl_CullDistance[", cull_distance_count, "];");
		if (clip_distance_count != 0 || cull_distance_count != 0)
			statement("");
	}

	if (global_invariant_position)
	{
		statement("invariant gl_Position;");
		statement("");
	}

	bool emitted = false;

	// If emitted Vulkan GLSL,
	// emit specialization constants as actual floats,
	// spec op expressions will redirect to the constant name.
	//
	{
		auto loop_lock = ir.create_loop_hard_lock();
		for (auto &id_ : ir.ids_for_constant_undef_or_type)
		{
			auto &id = ir.ids[id_];

			// Skip declaring any bogus constants or undefs which use block types.
			// We don't declare block types directly, so this will never work.
			// Should not be legal SPIR-V, so this is considered a workaround.

			if (id.get_type() == TypeConstant)
			{
				auto &c = id.get<SPIRConstant>();

				bool needs_declaration = c.specialization || c.is_used_as_lut;

				if (needs_declaration)
				{
					if (!options.vulkan_semantics && c.specialization)
					{
						c.specialization_constant_macro_name =
						    constant_value_macro_name(get_decoration(c.self, DecorationSpecId));
					}
					emit_constant(c);
					emitted = true;
				}
			}
			else if (id.get_type() == TypeConstantOp)
			{
				emit_specialization_constant_op(id.get<SPIRConstantOp>());
				emitted = true;
			}
			else if (id.get_type() == TypeType)
			{
				auto *type = &id.get<SPIRType>();

				bool is_natural_struct = type->basetype == SPIRType::Struct && type->array.empty() && !type->pointer &&
				                         (!has_decoration(type->self, DecorationBlock) &&
				                          !has_decoration(type->self, DecorationBufferBlock));

				// Special case, ray payload and hit attribute blocks are not really blocks, just regular structs.
				if (type->basetype == SPIRType::Struct && type->pointer &&
				    has_decoration(type->self, DecorationBlock) &&
				    (type->storage == StorageClassRayPayloadKHR || type->storage == StorageClassIncomingRayPayloadKHR ||
				     type->storage == StorageClassHitAttributeKHR))
				{
					type = &get<SPIRType>(type->parent_type);
					is_natural_struct = true;
				}

				if (is_natural_struct)
				{
					if (emitted)
						statement("");
					emitted = false;

					emit_struct(*type);
				}
			}
			else if (id.get_type() == TypeUndef)
			{
				auto &undef = id.get<SPIRUndef>();
				auto &type = this->get<SPIRType>(undef.basetype);
				// OpUndef can be void for some reason ...
				if (type.basetype == SPIRType::Void)
					continue;

				// This will break. It is bogus and should not be legal.
				if (type_is_top_level_block(type))
					continue;

				string initializer;
				if (options.force_zero_initialized_variables && type_can_zero_initialize(type))
					initializer = join(" = ", to_zero_initialized_expression(undef.basetype));

				// FIXME: If used in a constant, we must declare it as one.
				statement(variable_decl(type, to_name(undef.self), undef.self), initializer, ";");
				emitted = true;
			}
		}
	}

	if (emitted)
		statement("");

	// If we needed to declare work group size late, check here.
	// If the work group size depends on a specialization constant, we need to declare the layout() block
	// after constants (and their macros) have been declared.
	if (execution.model == ExecutionModelGLCompute && !options.vulkan_semantics &&
	    (execution.workgroup_size.constant != 0 || execution.flags.get(ExecutionModeLocalSizeId)))
	{
		SpecializationConstant wg_x, wg_y, wg_z;
		get_work_group_size_specialization_constants(wg_x, wg_y, wg_z);

		if ((wg_x.id != ConstantID(0)) || (wg_y.id != ConstantID(0)) || (wg_z.id != ConstantID(0)))
		{
			SmallVector<string> inputs;
			build_workgroup_size(inputs, wg_x, wg_y, wg_z);
			statement("layout(", merge(inputs), ") in;");
			statement("");
		}
	}

	emitted = false;

	if (ir.addressing_model == AddressingModelPhysicalStorageBuffer64EXT)
	{
		// Output buffer reference blocks.
		// Do this in two stages, one with forward declaration,
		// and one without. Buffer reference blocks can reference themselves
		// to support things like linked lists.
		ir.for_each_typed_id<SPIRType>([&](uint32_t id, SPIRType &type) {
			if (is_physical_pointer(type))
			{
				bool emit_type = true;
				if (!is_physical_pointer_to_buffer_block(type))
				{
					// Only forward-declare if we intend to emit it in the non_block_pointer types.
					// Otherwise, these are just "benign" pointer types that exist as a result of access chains.
					emit_type = std::find(physical_storage_non_block_pointer_types.begin(),
					                      physical_storage_non_block_pointer_types.end(),
					                      id) != physical_storage_non_block_pointer_types.end();
				}

				if (emit_type)
					emit_buffer_reference_block(id, true);
			}
		});

		for (auto type : physical_storage_non_block_pointer_types)
			emit_buffer_reference_block(type, false);

		ir.for_each_typed_id<SPIRType>([&](uint32_t id, SPIRType &type) {
			if (is_physical_pointer_to_buffer_block(type))
				emit_buffer_reference_block(id, false);
		});
	}

	// Output UBOs and SSBOs
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
		auto &type = this->get<SPIRType>(var.basetype);

		bool is_block_storage = type.storage == StorageClassStorageBuffer || type.storage == StorageClassUniform ||
		                        type.storage == StorageClassShaderRecordBufferKHR;
		bool has_block_flags = ir.meta[type.self].decoration.decoration_flags.get(DecorationBlock) ||
		                       ir.meta[type.self].decoration.decoration_flags.get(DecorationBufferBlock);

		if (var.storage != StorageClassFunction && type.pointer && is_block_storage && !is_hidden_variable(var) &&
		    has_block_flags)
		{
			emit_buffer_block(var);
		}
	});

	// Output push constant blocks
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
		auto &type = this->get<SPIRType>(var.basetype);
		if (var.storage != StorageClassFunction && type.pointer && type.storage == StorageClassPushConstant &&
		    !is_hidden_variable(var))
		{
			emit_push_constant_block(var);
		}
	});

	bool skip_separate_image_sampler = !combined_image_samplers.empty() || !options.vulkan_semantics;

	// Output Uniform Constants (values, samplers, images, etc).
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
		auto &type = this->get<SPIRType>(var.basetype);

		// If we're remapping separate samplers and images, only emit the combined samplers.
		if (skip_separate_image_sampler)
		{
			// Sampler buffers are always used without a sampler, and they will also work in regular GL.
			bool sampler_buffer = type.basetype == SPIRType::Image && type.image.dim == DimBuffer;
			bool separate_image = type.basetype == SPIRType::Image && type.image.sampled == 1;
			bool separate_sampler = type.basetype == SPIRType::Sampler;
			if (!sampler_buffer && (separate_image || separate_sampler))
				return;
		}

		if (var.storage != StorageClassFunction && type.pointer &&
		    (type.storage == StorageClassUniformConstant || type.storage == StorageClassAtomicCounter ||
		     type.storage == StorageClassRayPayloadKHR || type.storage == StorageClassIncomingRayPayloadKHR ||
		     type.storage == StorageClassCallableDataKHR || type.storage == StorageClassIncomingCallableDataKHR ||
		     type.storage == StorageClassHitAttributeKHR) &&
		    !is_hidden_variable(var))
		{
			emit_uniform(var);
			emitted = true;
		}
	});

	if (emitted)
		statement("");
	emitted = false;

	bool emitted_base_instance = false;

	// Output in/out interfaces.
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
		auto &type = this->get<SPIRType>(var.basetype);

		bool is_hidden = is_hidden_variable(var);

		// Unused output I/O variables might still be required to implement framebuffer fetch.
		if (var.storage == StorageClassOutput && !is_legacy() &&
		    location_is_framebuffer_fetch(get_decoration(var.self, DecorationLocation)) != 0)
		{
			is_hidden = false;
		}

		if (var.storage != StorageClassFunction && type.pointer &&
		    (var.storage == StorageClassInput || var.storage == StorageClassOutput) &&
		    interface_variable_exists_in_entry_point(var.self) && !is_hidden)
		{
			if (options.es && get_execution_model() == ExecutionModelVertex && var.storage == StorageClassInput &&
			    type.array.size() == 1)
			{
				SPIRV_CROSS_THROW("OpenGL ES doesn't support array input variables in vertex shader.");
			}
			emit_interface_block(var);
			emitted = true;
		}
		else if (is_builtin_variable(var))
		{
			auto builtin = BuiltIn(get_decoration(var.self, DecorationBuiltIn));
			// For gl_InstanceIndex emulation on GLES, the API user needs to
			// supply this uniform.

			// The draw parameter extension is soft-enabled on GL with some fallbacks.
			if (!options.vulkan_semantics)
			{
				if (!emitted_base_instance &&
				    ((options.vertex.support_nonzero_base_instance && builtin == BuiltInInstanceIndex) ||
				     (builtin == BuiltInBaseInstance)))
				{
					statement("#ifdef GL_ARB_shader_draw_parameters");
					statement("#define SPIRV_Cross_BaseInstance gl_BaseInstanceARB");
					statement("#else");
					// A crude, but simple workaround which should be good enough for non-indirect draws.
					statement("uniform int SPIRV_Cross_BaseInstance;");
					statement("#endif");
					emitted = true;
					emitted_base_instance = true;
				}
				else if (builtin == BuiltInBaseVertex)
				{
					statement("#ifdef GL_ARB_shader_draw_parameters");
					statement("#define SPIRV_Cross_BaseVertex gl_BaseVertexARB");
					statement("#else");
					// A crude, but simple workaround which should be good enough for non-indirect draws.
					statement("uniform int SPIRV_Cross_BaseVertex;");
					statement("#endif");
				}
				else if (builtin == BuiltInDrawIndex)
				{
					statement("#ifndef GL_ARB_shader_draw_parameters");
					// Cannot really be worked around.
					statement("#error GL_ARB_shader_draw_parameters is not supported.");
					statement("#endif");
				}
			}
		}
	});

	// Global variables.
	for (auto global : global_variables)
	{
		auto &var = get<SPIRVariable>(global);
		if (is_hidden_variable(var, true))
			continue;

		if (var.storage != StorageClassOutput)
		{
			if (!variable_is_lut(var))
			{
				add_resource_name(var.self);

				string initializer;
				if (options.force_zero_initialized_variables && var.storage == StorageClassPrivate &&
				    !var.initializer && !var.static_expression && type_can_zero_initialize(get_variable_data_type(var)))
				{
					initializer = join(" = ", to_zero_initialized_expression(get_variable_data_type_id(var)));
				}

				statement(variable_decl(var), initializer, ";");
				emitted = true;
			}
		}
		else if (var.initializer && maybe_get<SPIRConstant>(var.initializer) != nullptr)
		{
			emit_output_variable_initializer(var);
		}
	}

	if (emitted)
		statement("");
}